

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTestTest.cpp
# Opt level: O2

void __thiscall SuiteTestTest::SuiteTestTest(SuiteTestTest *this)

{
  pointer p_Var1;
  allocator<char> local_172;
  __allocator_type __a2;
  undefined1 local_170 [16];
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_160;
  shared_ptr<oout::FunctionText> local_148;
  shared_ptr<oout::EqualMatch> local_138;
  shared_ptr<oout::NamedTest> local_128;
  char local_118 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  shared_ptr<oout::EqualTest> local_108;
  shared_ptr<oout::EqualTest> local_f8;
  unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  shared_ptr<TestText> local_d8;
  shared_ptr<oout::NamedTest> local_c8;
  unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  shared_ptr<TestText> local_a8;
  shared_ptr<oout::NamedTest> local_98;
  undefined1 local_88 [16];
  code *local_78;
  code *local_70;
  shared_ptr<oout::EqualMatch> local_68;
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_58;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SuiteTestTest",&local_172)
  ;
  local_58._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_58;
  local_58._M_impl._M_node._M_size = 0;
  local_58._M_impl._M_node.super__List_node_base._M_prev =
       local_58._M_impl._M_node.super__List_node_base._M_next;
  std::
  make_unique<oout::SuiteTest,std::__cxx11::list<std::shared_ptr<oout::Test_const>,std::allocator<std::shared_ptr<oout::Test_const>>>>
            (&local_160);
  std::make_shared<TestText,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            (&local_b8);
  std::make_shared<oout::EqualTest,std::shared_ptr<TestText>,char_const(&)[8]>
            (&local_a8,(char (*) [8])&local_b8);
  std::make_shared<oout::NamedTest,char_const(&)[44],std::shared_ptr<oout::EqualTest>>
            ((char (*) [44])&local_98,
             (shared_ptr<oout::EqualTest> *)"SuiteTest with empty list is always success");
  std::make_shared<oout::EqualTest,char_const(&)[2],char_const(&)[2]>
            ((char (*) [2])&local_f8,(char (*) [2])0x1a88ff);
  std::make_shared<oout::EqualTest,char_const(&)[2],char_const(&)[2]>
            ((char (*) [2])&local_108,(char (*) [2])0x1a8903);
  std::make_shared<oout::EqualTest,char_const(&)[2],char_const(&)[2]>
            ((char (*) [2])local_118,(char (*) [2])0x1a8907);
  std::
  make_unique<oout::SuiteTest,std::shared_ptr<oout::EqualTest>,std::shared_ptr<oout::EqualTest>,std::shared_ptr<oout::EqualTest>>
            ((shared_ptr<oout::EqualTest> *)(local_170 + 8),&local_f8,&local_108);
  std::make_shared<TestText,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            (&local_e8);
  std::make_shared<oout::EqualTest,std::shared_ptr<TestText>,char_const(&)[8]>
            (&local_d8,(char (*) [8])&local_e8);
  std::make_shared<oout::NamedTest,char_const(&)[38],std::shared_ptr<oout::EqualTest>>
            ((char (*) [38])&local_c8,
             (shared_ptr<oout::EqualTest> *)"SuiteTest give tests as variadic args");
  local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<oout::FunctionText,_std::allocator<oout::FunctionText>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate((allocator_type *)&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001cc228;
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/test/SuiteTestTest.cpp:46:7)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/test/SuiteTestTest.cpp:46:7)>
             ::_M_manager;
  local_160.
  super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&__a2;
  local_160.
  super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ._M_impl._M_node._M_size = (size_t)p_Var1;
  oout::FunctionText::FunctionText
            ((FunctionText *)&p_Var1->_M_impl,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  local_160.
  super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ._M_impl._M_node._M_size = 0;
  local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&p_Var1->_M_impl;
  local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oout::FunctionText,_std::allocator<oout::FunctionText>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oout::FunctionText,_std::allocator<oout::FunctionText>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_160.
                         super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev);
  std::make_shared<oout::EqualMatch,char_const(&)[5]>((char (*) [5])local_88);
  std::
  make_shared<oout::MatchTest,std::shared_ptr<oout::FunctionText>,std::shared_ptr<oout::EqualMatch>>
            (&local_148,&local_68);
  std::make_unique<oout::SuiteTest,std::shared_ptr<oout::MatchTest>>
            ((shared_ptr<oout::MatchTest> *)local_170);
  std::make_shared<TestText,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_138);
  std::make_shared<oout::EqualMatch,char_const(&)[6]>
            ((char (*) [6])
             &local_160.
              super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev);
  std::
  make_shared<oout::NamedTest,char_const(&)[46],std::shared_ptr<TestText>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [46])&local_128,
             (shared_ptr<TestText> *)"SuiteTest run each test in SafeTest decorator",&local_138);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_40,&local_98,&local_c8,&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_160.
              super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              ._M_impl._M_node._M_size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_148.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)(local_170 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_160);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ::_M_clear(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001ccbb8;
  return;
}

Assistant:

SuiteTestTest::SuiteTestTest()
: dirty::Test(
	"SuiteTestTest",
	make_shared<NamedTest>(
		"SuiteTest with empty list is always success",
		make_shared<EqualTest>(
			make_shared<TestText>(
				make_unique<SuiteTest>(
					list<shared_ptr<const oout::Test>>{}
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"SuiteTest give tests as variadic args",
		make_shared<EqualTest>(
			make_shared<TestText>(
				make_unique<SuiteTest>(
					make_shared<EqualTest>("1", "1"),
					make_shared<EqualTest>("2", "2"),
					make_shared<EqualTest>("3", "3")
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"SuiteTest run each test in SafeTest decorator",
		make_shared<TestText>(
			make_unique<SuiteTest>(
				make_shared<MatchTest>(
					make_shared<FunctionText>(
						[]() -> string {
							throw runtime_error("Shit");
						}
					),
					make_shared<EqualMatch>("Good")  // Not happen
				)
			)
		),
		make_shared<EqualMatch>("error")
	)
)
{
}